

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

AffineSpace3ff * __thiscall
embree::XMLLoader::loadQuaternion
          (AffineSpace3ff *__return_storage_ptr__,XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *pXVar1;
  Token *this_00;
  bool bVar2;
  float fVar3;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  allocator local_1e9;
  string local_1e8;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  float local_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined1 local_188 [8];
  undefined8 uStack_180;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  undefined8 uStack_100;
  float local_f8;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  pXVar1 = xml->ptr;
  std::__cxx11::string::string((string *)local_1c8,"translate",&local_1e9);
  XML::parm(&local_1e8,pXVar1,(string *)local_1c8);
  bVar2 = std::operator!=(&local_1e8,"");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)local_1c8);
  if (bVar2) {
    pXVar1 = xml->ptr;
    std::__cxx11::string::string((string *)&local_1e8,"translate",&local_1e9);
    XML::parm(&local_40,pXVar1,&local_1e8);
    string_to_Vec3f((embree *)local_1c8,&local_40);
    local_168 = ZEXT416((uint)local_1c8._0_4_);
    local_198 = CONCAT44(fStack_1c0,local_1c8._4_4_);
    uStack_190 = 0;
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  else {
    local_198 = 0;
    uStack_190 = 0;
    local_168 = ZEXT816(0);
  }
  pXVar1 = xml->ptr;
  std::__cxx11::string::string((string *)local_1c8,"scale",&local_1e9);
  XML::parm(&local_1e8,pXVar1,(string *)local_1c8);
  bVar2 = std::operator!=(&local_1e8,"");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)local_1c8);
  if (bVar2) {
    pXVar1 = xml->ptr;
    std::__cxx11::string::string((string *)&local_1e8,"scale",&local_1e9);
    XML::parm(&local_60,pXVar1,&local_1e8);
    string_to_Vec3f((embree *)local_1c8,&local_60);
    local_178 = ZEXT416((uint)local_1c8._0_4_);
    local_158 = CONCAT44(fStack_1c0,local_1c8._4_4_);
    uStack_150 = 0;
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  else {
    local_158 = 0x3f8000003f800000;
    uStack_150 = 0;
    local_178 = ZEXT816(0x3f800000);
  }
  pXVar1 = xml->ptr;
  std::__cxx11::string::string((string *)local_1c8,"skew",&local_1e9);
  XML::parm(&local_1e8,pXVar1,(string *)local_1c8);
  bVar2 = std::operator!=(&local_1e8,"");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)local_1c8);
  if (bVar2) {
    pXVar1 = xml->ptr;
    std::__cxx11::string::string((string *)&local_1e8,"skew",&local_1e9);
    XML::parm(&local_80,pXVar1,&local_1e8);
    string_to_Vec3f((embree *)local_1c8,&local_80);
    local_118 = ZEXT416((uint)local_1c8._0_4_);
    local_148 = CONCAT44(fStack_1c0,local_1c8._4_4_);
    uStack_140 = 0;
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  else {
    local_148 = 0;
    uStack_140 = 0;
    local_118 = ZEXT816(0);
  }
  pXVar1 = xml->ptr;
  std::__cxx11::string::string((string *)local_1c8,"shift",&local_1e9);
  XML::parm(&local_1e8,pXVar1,(string *)local_1c8);
  bVar2 = std::operator!=(&local_1e8,"");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)local_1c8);
  if (bVar2) {
    pXVar1 = xml->ptr;
    std::__cxx11::string::string((string *)&local_1e8,"shift",&local_1e9);
    XML::parm(&local_a0,pXVar1,&local_1e8);
    string_to_Vec3f((embree *)local_1c8,&local_a0);
    local_138 = CONCAT44(local_1c8._4_4_,local_1c8._0_4_);
    uStack_130 = 0;
    local_128 = ZEXT416((uint)fStack_1c0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  else {
    local_138 = 0;
    uStack_130 = 0;
    local_128 = ZEXT816(0);
  }
  pXVar1 = xml->ptr;
  std::__cxx11::string::string((string *)local_1c8,"rotate",&local_1e9);
  XML::parm(&local_1e8,pXVar1,(string *)local_1c8);
  bVar2 = std::operator!=(&local_1e8,"");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)local_1c8);
  if (bVar2) {
    pXVar1 = xml->ptr;
    std::__cxx11::string::string((string *)&local_1e8,"rotate",&local_1e9);
    XML::parm(&local_c0,pXVar1,&local_1e8);
    string_to_Vec4f((embree *)local_1c8,&local_c0);
    _local_188 = ZEXT416((uint)local_1c8._0_4_);
    local_19c = fStack_1bc * 0.017453292 * 0.5;
    local_108 = (float)local_1c8._4_4_;
    fStack_104 = fStack_1c0;
    uStack_100 = 0;
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_1e8);
    local_f8 = cosf(local_19c);
    fVar3 = sinf(local_19c);
    fVar4 = (float)local_188._0_4_ * (float)local_188._0_4_ +
            local_108 * local_108 + fStack_104 * fStack_104;
    auVar6._4_4_ = local_188._4_4_;
    auVar6._0_4_ = fVar4;
    auVar6._8_4_ = (float)uStack_180;
    auVar6._12_4_ = uStack_180._4_4_;
    auVar7._4_4_ = local_188._4_4_;
    auVar7._0_4_ = fVar4;
    auVar7._8_4_ = (float)uStack_180;
    auVar7._12_4_ = uStack_180._4_4_;
    auVar7 = rsqrtss(auVar6,auVar7);
    fVar5 = auVar7._0_4_;
    fVar4 = fVar5 * 1.5 - fVar5 * fVar5 * fVar4 * 0.5 * fVar5;
    local_188._4_4_ = fVar3 * fVar4 * local_108;
    local_188._0_4_ = (float)local_188._0_4_ * fVar4 * fVar3;
    uStack_180._0_4_ = fVar3 * fVar4 * fStack_104;
    uStack_180._4_4_ = local_f8;
  }
  else {
    _local_188 = ZEXT816(0x3f80000000000000) << 0x40;
  }
  pXVar1 = xml->ptr;
  std::__cxx11::string::string((string *)local_1c8,"quaternion",&local_1e9);
  XML::parm(&local_1e8,pXVar1,(string *)local_1c8);
  bVar2 = std::operator!=(&local_1e8,"");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)local_1c8);
  if (bVar2) {
    pXVar1 = xml->ptr;
    std::__cxx11::string::string((string *)&local_1e8,"quaternion",&local_1e9);
    XML::parm(&local_e0,pXVar1,&local_1e8);
    string_to_Vec4f((embree *)local_1c8,&local_e0);
    local_188._4_4_ = local_1c8._4_4_;
    local_188._0_4_ = local_1c8._0_4_;
    uStack_180._4_4_ = fStack_1bc;
    uStack_180._0_4_ = fStack_1c0;
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  (__return_storage_ptr__->l).vx.field_0.m128[0] = (float)local_178._0_4_;
  (__return_storage_ptr__->l).vx.field_0.m128[1] = (float)local_138;
  (__return_storage_ptr__->l).vx.field_0.m128[2] = local_138._4_4_;
  (__return_storage_ptr__->l).vx.field_0.m128[3] = (float)local_188._0_4_;
  (__return_storage_ptr__->l).vy.field_0.m128[0] = (float)local_118._0_4_;
  (__return_storage_ptr__->l).vy.field_0.m128[1] = (float)local_158;
  (__return_storage_ptr__->l).vy.field_0.m128[2] = (float)local_128._0_4_;
  (__return_storage_ptr__->l).vy.field_0.m128[3] = (float)local_188._4_4_;
  (__return_storage_ptr__->l).vz.field_0.m128[0] = (float)local_148;
  (__return_storage_ptr__->l).vz.field_0.m128[1] = local_148._4_4_;
  (__return_storage_ptr__->l).vz.field_0.m128[2] = local_158._4_4_;
  (__return_storage_ptr__->l).vz.field_0.m128[3] = (float)uStack_180;
  (__return_storage_ptr__->p).field_0.m128[0] = (float)local_168._0_4_;
  (__return_storage_ptr__->p).field_0.m128[1] = (float)local_198;
  (__return_storage_ptr__->p).field_0.m128[2] = local_198._4_4_;
  (__return_storage_ptr__->p).field_0.m128[3] = uStack_180._4_4_;
  this_00 = (xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((long)(xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)this_00 == 0x480) {
    local_188._0_4_ = Token::Float(this_00,true);
    local_188._4_4_ = extraout_XMM0_Db;
    uStack_180._0_4_ = (float)extraout_XMM0_Dc;
    uStack_180._4_4_ = (float)extraout_XMM0_Dd;
    local_168._0_4_ =
         Token::Float((xml->ptr->body).
                      super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                      super__Vector_impl_data._M_start + 4,true);
    local_168._4_4_ = extraout_XMM0_Db_00;
    local_168._8_4_ = extraout_XMM0_Dc_00;
    local_168._12_4_ = extraout_XMM0_Dd_00;
    fVar3 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 8,true);
    local_198 = CONCAT44(extraout_XMM0_Db_01,fVar3);
    fVar3 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 0xc,true);
    local_188._4_4_ = local_168._0_4_;
    uStack_180._0_4_ = (float)local_198;
    uStack_180._4_4_ = fVar3;
    local_168._0_4_ =
         Token::Float((xml->ptr->body).
                      super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                      super__Vector_impl_data._M_start + 1,true);
    local_168._4_4_ = extraout_XMM0_Db_02;
    local_168._8_4_ = extraout_XMM0_Dc_01;
    local_168._12_4_ = extraout_XMM0_Dd_01;
    fVar3 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 5,true);
    local_198 = CONCAT44(extraout_XMM0_Db_03,fVar3);
    local_178._0_4_ =
         Token::Float((xml->ptr->body).
                      super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                      super__Vector_impl_data._M_start + 9,true);
    local_178._4_4_ = extraout_XMM0_Db_04;
    local_178._8_4_ = extraout_XMM0_Dc_02;
    local_178._12_4_ = extraout_XMM0_Dd_02;
    fVar3 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 0xd,true);
    local_168._4_4_ = (float)local_198;
    local_168._8_4_ = local_178._0_4_;
    local_168._12_4_ = fVar3;
    fVar3 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 2,true);
    local_198 = CONCAT44(extraout_XMM0_Db_05,fVar3);
    local_178._0_4_ =
         Token::Float((xml->ptr->body).
                      super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                      super__Vector_impl_data._M_start + 6,true);
    local_178._4_4_ = extraout_XMM0_Db_06;
    local_178._8_4_ = extraout_XMM0_Dc_03;
    local_178._12_4_ = extraout_XMM0_Dd_03;
    fVar3 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 10,true);
    local_158 = CONCAT44(extraout_XMM0_Db_07,fVar3);
    fVar3 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 0xe,true);
    local_198 = CONCAT44(local_178._0_4_,(int)local_198);
    uStack_190 = CONCAT44(fVar3,(int)local_158);
    local_178._0_4_ =
         Token::Float((xml->ptr->body).
                      super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                      super__Vector_impl_data._M_start + 3,true);
    local_178._4_4_ = extraout_XMM0_Db_08;
    local_178._8_4_ = extraout_XMM0_Dc_04;
    local_178._12_4_ = extraout_XMM0_Dd_04;
    fVar3 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 7,true);
    local_158 = CONCAT44(extraout_XMM0_Db_09,fVar3);
    fVar3 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 0xb,true);
    local_148 = CONCAT44(extraout_XMM0_Db_10,fVar3);
    fVar3 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 0xf,true);
    *(undefined1 (*) [8])&(__return_storage_ptr__->l).vx.field_0 = local_188;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vx.field_0 + 8) = uStack_180;
    *(undefined8 *)&(__return_storage_ptr__->l).vy.field_0 = local_168._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vy.field_0 + 8) = local_168._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->l).vz.field_0 = local_198;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vz.field_0 + 8) = uStack_190;
    (__return_storage_ptr__->p).field_0.m128[0] = (float)local_178._0_4_;
    (__return_storage_ptr__->p).field_0.m128[1] = (float)local_158;
    (__return_storage_ptr__->p).field_0.m128[2] = (float)local_148;
    (__return_storage_ptr__->p).field_0.m128[3] = fVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

AffineSpace3ff XMLLoader::loadQuaternion(const Ref<XML>& xml)
  {
    Vec3f scale(1.f, 1.f, 1.f);
    Vec3f shift(0.f, 0.f, 0.f);
    Vec3f skew(0.f, 0.f, 0.f);
    Vec3f translate(0.f, 0.f, 0.f);
    Vec4f q(0.f, 0.f, 0.f, 1.f);

    if (xml->parm("translate") != "")
      translate = string_to_Vec3f(xml->parm("translate"));
    if (xml->parm("scale") != "")
      scale = string_to_Vec3f(xml->parm("scale"));
    if (xml->parm("skew") != "")
      skew = string_to_Vec3f(xml->parm("skew"));
    if (xml->parm("shift") != "")
      shift = string_to_Vec3f(xml->parm("shift"));
    if (xml->parm("rotate") != "") {
      q = string_to_Vec4f(xml->parm("rotate"));
      // convert from degree to radians
      q.w = 2.f*M_PI/360.f*q.w;
      Quaternion3f Q = Quaternion3f::rotate(Vec3fa(q.x, q.y, q.z), q.w);
      q = Vec4f(Q.i, Q.j, Q.k, Q.r);
    }
    if (xml->parm("quaternion") != "") {
      q = string_to_Vec4f(xml->parm("quaternion"));
    }

    AffineSpace3ff res(LinearSpace3fa(
      Vec3ff(scale.x, shift.x, shift.y, q.x),
      Vec3ff(skew.x, scale.y, shift.z, q.y),
      Vec3ff(skew.y, skew.z, scale.z, q.z)),
      Vec3ff(translate.x, translate.y, translate.z, q.w));

    if (xml->body.size() == 16) {
      res = AffineSpace3ff(LinearSpace3fa(Vec3ff(xml->body[ 0].Float(),xml->body[ 4].Float(),xml->body[ 8].Float(),xml->body[12].Float()),
                                          Vec3ff(xml->body[ 1].Float(),xml->body[ 5].Float(),xml->body[ 9].Float(),xml->body[13].Float()),
                                          Vec3ff(xml->body[ 2].Float(),xml->body[ 6].Float(),xml->body[10].Float(),xml->body[14].Float())),
                                          Vec3ff(xml->body[ 3].Float(),xml->body[ 7].Float(),xml->body[11].Float(),xml->body[15].Float()));
    }
    return res;
  }